

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfirstdiff_s.c
# Opt level: O0

errno_t strfirstdiff_s(char *dest,rsize_t dmax,char *src,rsize_t *index)

{
  long lVar1;
  long *in_RCX;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  bool bVar2;
  char *rp;
  errno_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  char *local_28;
  ulong local_20;
  char *local_18;
  errno_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RCX == (long *)0x0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffc8,
               (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
    local_c = 400;
  }
  else {
    *in_RCX = 0;
    if (in_RDI == (char *)0x0) {
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffc8,
                 (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc);
      local_c = 400;
    }
    else if (in_RDX == (char *)0x0) {
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffc8,
                 (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc);
      local_c = 400;
    }
    else if (in_RSI == 0) {
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffc8,
                 (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc);
      local_c = 0x191;
    }
    else {
      local_28 = in_RDX;
      local_20 = in_RSI;
      local_18 = in_RDI;
      if (in_RSI < 0x10000001) {
        while( true ) {
          bVar2 = false;
          if ((*local_18 != '\0') && (bVar2 = false, *local_28 != '\0')) {
            bVar2 = local_20 != 0;
          }
          if (!bVar2) {
            local_c = 0x198;
            goto LAB_0010a038;
          }
          if (*local_18 != *local_28) break;
          local_20 = local_20 - 1;
          local_18 = local_18 + 1;
          local_28 = local_28 + 1;
        }
        *in_RCX = (long)local_18 - (long)in_RDI;
        local_c = 0;
      }
      else {
        invoke_safe_str_constraint_handler
                  (in_stack_ffffffffffffffc8,
                   (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc);
        local_c = 0x193;
      }
    }
  }
LAB_0010a038:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

errno_t
 strfirstdiff_s (const char *dest, rsize_t dmax,
                 const char *src, rsize_t *index)
{
    const char *rp;

    if (index == NULL) {
        invoke_safe_str_constraint_handler("strfirstdiff_s: index is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }
    *index = 0;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strfirstdiff_s: dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (src == NULL) {
        invoke_safe_str_constraint_handler("strfirstdiff_s: src is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0 ) {
        invoke_safe_str_constraint_handler("strfirstdiff_s: dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strfirstdiff_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    /* hold reference point */
    rp = dest;

    while (*dest && *src && dmax) {

        if (*dest != *src) {
            *index = dest - rp;
            return (EOK);
        }
        dmax--;
        dest++;
        src++;
    }

    return (ESNODIFF);
}